

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::unpack_expression_type
          (string *__return_storage_ptr__,CompilerMSL *this,string *expr_str,SPIRType *type,
          uint32_t physical_type_id,bool packed,bool row_major)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  bool bVar4;
  uint __tmp;
  int iVar5;
  SPIRType *type_00;
  long *plVar6;
  long lVar7;
  size_type *psVar8;
  undefined7 in_register_00000089;
  char (*ts_3) [2];
  char cVar9;
  undefined7 in_stack_ffffffffffffff88;
  char in_stack_ffffffffffffff8f;
  uint32_t columns;
  uint local_6c;
  string local_68;
  uint32_t physical_vecsize;
  uint32_t vecsize;
  char *load_swiz;
  char *base_type;
  
  ts_3 = (char (*) [2])CONCAT71(in_register_00000089,packed);
  if (physical_type_id == 0 && !packed) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (expr_str->_M_dataplus)._M_p;
    paVar1 = &expr_str->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar1) {
      uVar3 = *(undefined8 *)((long)&expr_str->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = expr_str->_M_string_length;
    (expr_str->_M_dataplus)._M_p = (pointer)paVar1;
    expr_str->_M_string_length = 0;
    (expr_str->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  type_00 = type;
  if (physical_type_id != 0) {
    type_00 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + physical_type_id);
    bVar4 = Compiler::is_vector((Compiler *)this,type_00);
    if (((bVar4) && (bVar4 = Compiler::is_array((Compiler *)this,type_00), bVar4)) &&
       (type->vecsize < type_00->vecsize)) {
      ::std::__cxx11::string::string
                ((string *)&local_68,unpack_expression_type::swizzle_lut[type->vecsize - 1],
                 (allocator *)&base_type);
      cVar9 = true;
      if (local_68._M_string_length <= (string *)expr_str->_M_string_length) {
        iVar5 = ::std::__cxx11::string::compare
                          ((ulong)expr_str,
                           (long)expr_str->_M_string_length - local_68._M_string_length,
                           (string *)local_68._M_string_length);
        cVar9 = iVar5 != 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
        in_stack_ffffffffffffff8f = cVar9;
      }
      if (cVar9 != '\0') {
        if (2 < type->vecsize - 1) {
          __assert_fail("type.vecsize >= 1 && type.vecsize <= 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0xefa,
                        "virtual string spirv_cross::CompilerMSL::unpack_expression_type(string, const SPIRType &, uint32_t, bool, bool)"
                       );
        }
        CompilerGLSL::enclose_expression(&local_68,&this->super_CompilerGLSL,expr_str);
        plVar6 = (long *)::std::__cxx11::string::append((char *)&local_68);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar8 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar8) {
          lVar7 = plVar6[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar7;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
        }
        __return_storage_ptr__->_M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p == &local_68.field_2) {
          return __return_storage_ptr__;
        }
        goto LAB_0025edab;
      }
    }
    bVar4 = Compiler::is_matrix((Compiler *)this,type_00);
    if (((bVar4) && (bVar4 = Compiler::is_vector((Compiler *)this,type), bVar4)) &&
       (type->vecsize < type_00->vecsize)) {
      if (2 < type->vecsize - 1) {
        __assert_fail("type.vecsize >= 1 && type.vecsize <= 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0xf00,
                      "virtual string spirv_cross::CompilerMSL::unpack_expression_type(string, const SPIRType &, uint32_t, bool, bool)"
                     );
      }
      CompilerGLSL::enclose_expression(&local_68,&this->super_CompilerGLSL,expr_str);
      ::std::operator+(__return_storage_ptr__,&local_68,
                       unpack_expression_type::swizzle_lut[type->vecsize - 1]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p == &local_68.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_0025edab;
    }
  }
  bVar4 = Compiler::is_matrix((Compiler *)this,type);
  if (bVar4) {
    vecsize = type->vecsize;
    if (row_major) {
      lVar7 = 0x18;
      columns = vecsize;
      vecsize = type->columns;
    }
    else {
      lVar7 = 0x14;
      columns = type->columns;
    }
    physical_vecsize = *(uint32_t *)((type_00->array).stack_storage.aligned_char + lVar7 + -0x38);
    base_type = "float";
    if (type->width == 0x10) {
      base_type = "half";
    }
    join<char_const*&,unsigned_int&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&base_type,(char **)&columns,(uint *)0x2def05,
               (char (*) [2])&vecsize,(uint *)0x2f3fa1,
               (char (*) [2])CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    load_swiz = "";
    if (physical_vecsize != vecsize) {
      load_swiz = unpack_expression_type::swizzle_lut[vecsize - 1];
    }
    local_6c = 0;
    if (columns != 0) {
      do {
        if (local_6c != 0) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        if (packed) {
          join<char_const*&,unsigned_int&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[2],char_const*&>
                    (&local_68,(spirv_cross *)&base_type,(char **)&physical_vecsize,(uint *)0x2f3fa1
                     ,(char (*) [2])expr_str,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f169e,
                     (char (*) [2])&local_6c,(uint *)0x2e390f,(char (*) [2])0x2dfe76,
                     (char (*) [2])&load_swiz,
                     (char **)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_68._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_0025ef29:
            operator_delete(local_68._M_dataplus._M_p);
          }
        }
        else {
          join<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const*&>
                    (&local_68,(spirv_cross *)expr_str,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f169e,
                     (char (*) [2])&local_6c,(uint *)0x2e390f,(char (*) [2])&load_swiz,
                     (char **)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_68._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) goto LAB_0025ef29;
        }
        local_6c = local_6c + 1;
      } while (local_6c < columns);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_68,this,type,0);
  join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
            (__return_storage_ptr__,(spirv_cross *)&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f3fa1,
             (char (*) [2])expr_str,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2dfe76,ts_3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == &local_68.field_2) {
    return __return_storage_ptr__;
  }
LAB_0025edab:
  operator_delete(local_68._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::unpack_expression_type(string expr_str, const SPIRType &type, uint32_t physical_type_id,
                                           bool packed, bool row_major)
{
	// Trivial case, nothing to do.
	if (physical_type_id == 0 && !packed)
		return expr_str;

	const SPIRType *physical_type = nullptr;
	if (physical_type_id)
		physical_type = &get<SPIRType>(physical_type_id);

	static const char *swizzle_lut[] = {
		".x",
		".xy",
		".xyz",
	};

	if (physical_type && is_vector(*physical_type) && is_array(*physical_type) &&
	    physical_type->vecsize > type.vecsize && !expression_ends_with(expr_str, swizzle_lut[type.vecsize - 1]))
	{
		// std140 array cases for vectors.
		assert(type.vecsize >= 1 && type.vecsize <= 3);
		return enclose_expression(expr_str) + swizzle_lut[type.vecsize - 1];
	}
	else if (physical_type && is_matrix(*physical_type) && is_vector(type) && physical_type->vecsize > type.vecsize)
	{
		// Extract column from padded matrix.
		assert(type.vecsize >= 1 && type.vecsize <= 3);
		return enclose_expression(expr_str) + swizzle_lut[type.vecsize - 1];
	}
	else if (is_matrix(type))
	{
		// Packed matrices are stored as arrays of packed vectors. Unfortunately,
		// we can't just pass the array straight to the matrix constructor. We have to
		// pass each vector individually, so that they can be unpacked to normal vectors.
		if (!physical_type)
			physical_type = &type;

		uint32_t vecsize = type.vecsize;
		uint32_t columns = type.columns;
		if (row_major)
			swap(vecsize, columns);

		uint32_t physical_vecsize = row_major ? physical_type->columns : physical_type->vecsize;

		const char *base_type = type.width == 16 ? "half" : "float";
		string unpack_expr = join(base_type, columns, "x", vecsize, "(");

		const char *load_swiz = "";

		if (physical_vecsize != vecsize)
			load_swiz = swizzle_lut[vecsize - 1];

		for (uint32_t i = 0; i < columns; i++)
		{
			if (i > 0)
				unpack_expr += ", ";

			if (packed)
				unpack_expr += join(base_type, physical_vecsize, "(", expr_str, "[", i, "]", ")", load_swiz);
			else
				unpack_expr += join(expr_str, "[", i, "]", load_swiz);
		}

		unpack_expr += ")";
		return unpack_expr;
	}
	else
	{
		return join(type_to_glsl(type), "(", expr_str, ")");
	}
}